

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::IsStringInlined(FieldDescriptor *descriptor,Options *options)

{
  bool bVar1;
  
  if (options->opensource_runtime != false) {
    return false;
  }
  bVar1 = IsAnyMessage(*(Descriptor **)(descriptor + 0x50),options);
  if ((((bVar1) || (*(char *)(*(long *)(*(long *)(descriptor + 0x50) + 0x20) + 0x4b) != '\0')) ||
      (*(int *)(*(long *)(descriptor + 0x28) + 0x3c) == 3)) ||
     ((options->access_info_map == (AccessInfoMap *)0x0 ||
      (bVar1 = true, *(int *)(descriptor + 0x3c) != 2)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsStringInlined(const FieldDescriptor* descriptor,
                     const Options& options) {
  if (options.opensource_runtime) return false;

  // TODO(ckennelly): Handle inlining for any.proto.
  if (IsAnyMessage(descriptor->containing_type(), options)) return false;
  if (descriptor->containing_type()->options().map_entry()) return false;

  // Limit to proto2, as we rely on has bits to distinguish field presence for
  // release_$name$.  On proto3, we cannot use the address of the string
  // instance when the field has been inlined.
  if (!HasFieldPresence(descriptor->file())) return false;

  if (options.access_info_map) {
    if (descriptor->is_required()) return true;
  }
  return false;
}